

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

int fy_emit_setup(fy_emitter *emit,fy_emitter_cfg *cfg)

{
  fy_diag_cfg *cfg_00;
  fy_diag *local_60;
  fy_diag *diag;
  fy_diag_cfg dcfg;
  fy_emitter_cfg *cfg_local;
  fy_emitter *emit_local;
  
  dcfg._48_8_ = cfg;
  memset(emit,0,0x558);
  emit->cfg = (fy_emitter_cfg *)dcfg._48_8_;
  local_60 = *(fy_diag **)(dcfg._48_8_ + 0x18);
  if (local_60 == (fy_diag *)0x0) {
    cfg_00 = fy_diag_cfg_from_parser((fy_diag_cfg *)&diag,(fy_parser *)0x0);
    local_60 = fy_diag_create(cfg_00);
    if (local_60 == (fy_diag *)0x0) {
      return -1;
    }
  }
  else {
    fy_diag_ref(local_60);
  }
  emit->diag = local_60;
  fy_emit_accum_init(&emit->ea,emit);
  fy_eventp_list_init(&emit->queued_events);
  emit->state_stack = emit->state_stack_inplace;
  emit->state_stack_alloc = 0x40;
  emit->sc_stack = emit->sc_stack_inplace;
  emit->sc_stack_alloc = 0x10;
  fy_emit_reset(emit,false);
  return 0;
}

Assistant:

int fy_emit_setup(struct fy_emitter *emit, const struct fy_emitter_cfg *cfg) {
    struct fy_diag_cfg dcfg;
    struct fy_diag *diag;

    memset(emit, 0, sizeof(*emit));

    emit->cfg = cfg;

    diag = cfg->diag;

    if (!diag) {
        diag = fy_diag_create(fy_diag_cfg_from_parser(&dcfg, NULL));
        if (!diag)
            return -1;
    } else
        fy_diag_ref(diag);

    emit->diag = diag;

    fy_emit_accum_init(&emit->ea, emit);
    fy_eventp_list_init(&emit->queued_events);

    emit->state_stack = emit->state_stack_inplace;
    emit->state_stack_alloc = sizeof(emit->state_stack_inplace) / sizeof(emit->state_stack_inplace[0]);

    emit->sc_stack = emit->sc_stack_inplace;
    emit->sc_stack_alloc = sizeof(emit->sc_stack_inplace) / sizeof(emit->sc_stack_inplace[0]);

    fy_emit_reset(emit, false);

    return 0;
}